

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode result;
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  conn->tls_upgraded = false;
  if ((((conn->bits).httpproxy & 1U) == 0) || (((pCVar1->set).tunnel_thru_httpproxy & 1U) != 0)) {
    conn_local._4_4_ = smtp_init(conn);
    if (conn_local._4_4_ == CURLE_OK) {
      (pCVar1->state).path = (pCVar1->state).path + 1;
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    if (conn->handler == &Curl_handler_smtp) {
      conn->handler = &Curl_handler_smtp_proxy;
    }
    else {
      conn->handler = &Curl_handler_smtps_proxy;
    }
    conn_local._4_4_ = (*conn->handler->setup_connection)(conn);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  CURLcode result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  /* Set up the proxy if necessary */
  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel SMTP operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_smtp)
      conn->handler = &Curl_handler_smtp_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_smtps_proxy;
#else
      failf(data, "SMTPS not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }
    /* set it up as a HTTP connection instead */
    return conn->handler->setup_connection(conn);

#else
    failf(data, "SMTP over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  /* Initialise the SMTP layer */
  result = smtp_init(conn);
  if(result)
    return result;

  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}